

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O0

Expression * __thiscall
slang::ast::builtins::PrintTimeScaleTask::bindArgument
          (PrintTimeScaleTask *this,size_t argIndex,ASTContext *context,ExpressionSyntax *syntax,
          Args *args)

{
  SourceRange sourceRange;
  bool bVar1;
  Compilation *this_00;
  SyntaxNode *in_RCX;
  ASTContext *in_RDX;
  long in_RSI;
  SourceLocation in_RDI;
  Compilation *comp;
  ASTContext *in_stack_00000290;
  NameSyntax *in_stack_00000298;
  Compilation *in_stack_000002a0;
  bitmask<slang::ast::LookupFlags> in_stack_000002ac;
  LookupFlags in_stack_ffffffffffffff6c;
  Type *in_stack_ffffffffffffff70;
  void **in_stack_ffffffffffffff78;
  Args *in_stack_ffffffffffffff80;
  ExpressionSyntax *in_stack_ffffffffffffff88;
  SourceLocation in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffa0;
  DiagCode in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffc0;
  InvalidExpression *local_8;
  
  if (in_RSI == 0) {
    this_00 = ASTContext::getCompilation((ASTContext *)0x7c0e1c);
    bVar1 = slang::syntax::NameSyntax::isKind(in_RCX->kind);
    if (bVar1) {
      slang::syntax::SyntaxNode::as<slang::syntax::NameSyntax>(in_RCX);
      ast::operator|((LookupFlags)this_00,in_stack_ffffffffffffff6c);
      local_8 = (InvalidExpression *)
                ArbitrarySymbolExpression::fromSyntax
                          (in_stack_000002a0,in_stack_00000298,in_stack_00000290,in_stack_000002ac);
    }
    else {
      slang::syntax::SyntaxNode::sourceRange
                ((SyntaxNode *)CONCAT44(0xb000b,in_stack_ffffffffffffffc0));
      sourceRange.endLoc = in_RDI;
      sourceRange.startLoc = in_stack_ffffffffffffff90;
      ASTContext::addDiag(in_RDX,in_stack_ffffffffffffffa4,sourceRange);
      Compilation::getErrorType(this_00);
      local_8 = BumpAllocator::
                emplace<slang::ast::InvalidExpression,decltype(nullptr),slang::ast::Type_const&>
                          ((BumpAllocator *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                           in_stack_ffffffffffffff70);
    }
  }
  else {
    local_8 = (InvalidExpression *)
              SystemSubroutine::bindArgument
                        ((SystemSubroutine *)
                         CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         (size_t)in_RDI,(ASTContext *)in_stack_ffffffffffffff90,
                         in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  }
  return &local_8->super_Expression;
}

Assistant:

const Expression& bindArgument(size_t argIndex, const ASTContext& context,
                                   const ExpressionSyntax& syntax, const Args& args) const final {
        if (argIndex == 0) {
            auto& comp = context.getCompilation();
            if (!NameSyntax::isKind(syntax.kind)) {
                context.addDiag(diag::ExpectedModuleName, syntax.sourceRange());
                return *comp.emplace<InvalidExpression>(nullptr, comp.getErrorType());
            }

            return ArbitrarySymbolExpression::fromSyntax(comp, syntax.as<NameSyntax>(), context,
                                                         LookupFlags::AllowRoot |
                                                             LookupFlags::AllowUnit);
        }

        return SystemTaskBase::bindArgument(argIndex, context, syntax, args);
    }